

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::ListOp<tinyusdz::Path>::ListOp
          (ListOp<tinyusdz::Path> *this,ListOp<tinyusdz::Path> *param_2)

{
  pointer pPVar1;
  
  this->is_explicit = param_2->is_explicit;
  pPVar1 = (param_2->explicit_items).
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->explicit_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
  .super__Vector_impl_data._M_start =
       (param_2->explicit_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->explicit_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
  .super__Vector_impl_data._M_finish = pPVar1;
  (this->explicit_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (param_2->explicit_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_2->explicit_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_2->explicit_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_2->explicit_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar1 = (param_2->added_items).
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->added_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_2->added_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->added_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = pPVar1;
  (this->added_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_2->added_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_2->added_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (param_2->added_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_2->added_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar1 = (param_2->prepended_items).
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->prepended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (param_2->prepended_items).
       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->prepended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_finish = pPVar1;
  (this->prepended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_2->prepended_items).
       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_2->prepended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_2->prepended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_2->prepended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar1 = (param_2->appended_items).
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->appended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
  .super__Vector_impl_data._M_start =
       (param_2->appended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->appended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
  .super__Vector_impl_data._M_finish = pPVar1;
  (this->appended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (param_2->appended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_2->appended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_2->appended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_2->appended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar1 = (param_2->deleted_items).
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->deleted_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_2->deleted_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->deleted_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = pPVar1;
  (this->deleted_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_2->deleted_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_2->deleted_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_2->deleted_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_2->deleted_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar1 = (param_2->ordered_items).
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->ordered_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_2->ordered_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->ordered_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = pPVar1;
  (this->ordered_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_2->ordered_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_2->ordered_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_2->ordered_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_2->ordered_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ListOp() : is_explicit(false) {}